

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

string_view __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
stringView(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  size_type __len;
  uint8_t *puVar2;
  unsigned_long __len_00;
  undefined8 uVar3;
  char *in_RDI;
  ValueLength length_1;
  ValueLength length;
  uint8_t h;
  undefined8 in_stack_ffffffffffffffc8;
  ExceptionType type;
  Exception *in_stack_ffffffffffffffd0;
  string_view local_18;
  size_type local_8;
  
  type = (ExceptionType)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  bVar1 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12a3b8);
  if ((bVar1 < 0x40) || (0xbe < bVar1)) {
    if (bVar1 != 0xbf) {
      uVar3 = __cxa_allocate_exception(0x18);
      Exception::Exception(in_stack_ffffffffffffffd0,type,in_RDI);
      __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
    }
    puVar2 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12a41c);
    __len_00 = readIntegerFixed<unsigned_long,8ul>(puVar2 + 1);
    puVar2 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12a437);
    local_8 = __len_00;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_18,(char *)(puVar2 + 9),__len_00);
  }
  else {
    __len = (size_type)(int)(bVar1 - 0x40);
    puVar2 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12a3eb);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_18,(char *)(puVar2 + 1),__len);
  }
  return local_18;
}

Assistant:

std::string_view stringView() const {
    uint8_t h = head();
    if (h >= 0x40 && h <= 0xbe) {
      // short UTF-8 String
      ValueLength length = h - 0x40;
      return std::string_view(reinterpret_cast<char const*>(start() + 1),
                              static_cast<std::size_t>(length));
    }

    if (h == 0xbf) {
      ValueLength length = readIntegerFixed<ValueLength, 8>(start() + 1);
      return std::string_view(reinterpret_cast<char const*>(start() + 1 + 8),
                              checkOverflow(length));
    }

    throw Exception(Exception::InvalidValueType, "Expecting type String");
  }